

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gleam.cxx
# Opt level: O1

void shade_rect_top_bottom(int x,int y,int w,int h,Fl_Color fg1,Fl_Color fg2,float th)

{
  int iVar1;
  Fl_Color FVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  float weight;
  float fVar6;
  float local_6c;
  float local_68;
  
  iVar4 = 0x14;
  if (h < 0x28) {
    iVar4 = h / 2;
  }
  iVar1 = 0xf;
  if (h < 0x5a) {
    iVar1 = h / 6;
  }
  weight = 1.0;
  if (iVar4 < 2) {
    fVar6 = 1.0;
  }
  else {
    fVar6 = 0.999 / (float)iVar4;
  }
  local_68 = 0.999 / (float)iVar1;
  uVar5 = y;
  do {
    FVar2 = fl_color_average(fg1,fg2,th);
    FVar2 = fl_color_average(FVar2,fg1,weight);
    Fl::set_box_color(FVar2);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
              (fl_graphics_driver,(ulong)(uint)x,(ulong)uVar5,(ulong)(uint)(w + x));
    weight = weight - fVar6;
    uVar5 = uVar5 + 1;
  } while (0.0 <= weight);
  uVar3 = h - (iVar1 + iVar4);
  if (iVar1 < 2) {
    local_68 = 1.0;
  }
  local_6c = 1.0;
  Fl::set_box_color(fg1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)(uint)x,(ulong)(uint)(iVar4 + y),(ulong)(w + 1),(ulong)uVar3)
  ;
  uVar5 = (uVar5 + uVar3) - 1;
  do {
    FVar2 = fl_color_average(fg1,fg2,th);
    FVar2 = fl_color_average(fg1,FVar2,local_6c);
    Fl::set_box_color(FVar2);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
              (fl_graphics_driver,(ulong)(uint)x,(ulong)uVar5,(ulong)(uint)(w + x));
    local_6c = local_6c - local_68;
    uVar5 = uVar5 + 1;
  } while (0.0 <= local_6c);
  return;
}

Assistant:

static void shade_rect_top_bottom(int x, int y, int w, int h, Fl_Color fg1, Fl_Color fg2, float th) {
  // Draws the shiny using maximum limits
  int h_top    = ((h/2) < (20) ? (h/2) : (20)); // min(h/2,20);
  int h_bottom = ((h/6) < (15) ? (h/6) : (15)); // min(h/6,15);
  int h_flat = h-(h_top+h_bottom);
  int j = 0;
  float step_size_top = h_top>1?(0.999f/(float)(h_top)):1;
  float step_size_bottom = h_bottom>1?(0.999f/(float)(h_bottom)):1;
  // This loop generates the gradient at the top of the widget
  for (float k = 1; k >= 0; k -= step_size_top){
    gleam_color(fl_color_average(fl_color_average(fg1, fg2, th), fg1, k));
    fl_xyline(x, y+j, x+w);
    j++;
  }
  gleam_color(fg1);
  fl_rectf(x, y+h_top, w+1, h_flat);
  // This loop generates the gradient at the bottom of the widget
  for (float k = 1; k >= 0; k -= step_size_bottom){
    gleam_color(fl_color_average(fg1,fl_color_average(fg1, fg2, th), k));
    fl_xyline(x, y+j+h_flat-1, x+w);
    j++;
  }
}